

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildHLBVH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,
          atomic<int> *totalNodes,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims)

{
  int *piVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  pointer pBVar5;
  pointer pBVar6;
  MortonPrimitive *pMVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  Point3f *pPVar10;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *pvVar11;
  pointer pMVar12;
  pointer pLVar13;
  pointer pLVar14;
  int pass;
  uint uVar15;
  int iVar16;
  undefined4 extraout_var;
  pointer pMVar17;
  BVHBuildNode *pBVar18;
  pointer pBVar19;
  pointer pMVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  MortonPrimitive *pMVar24;
  int i;
  MortonPrimitive *pMVar25;
  long lVar26;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *pvVar27;
  int iVar28;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *__range1;
  ulong uVar29;
  BVHBuildNode **__args;
  LBVHTreelet *pLVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  atomic<int> orderedPrimsOffset;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> finishedTreelets;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> treeletsToBuild;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> local_2f8;
  Allocator local_2d8;
  atomic<int> *local_2d0;
  vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> local_2c8;
  undefined8 local_2a8;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  BVHAggregate *local_290;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_288;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *local_280;
  long *local_278;
  undefined8 uStack_270;
  code *pcStack_268;
  code *pcStack_260;
  void *local_258;
  undefined8 uStack_250;
  code *pcStack_248;
  undefined8 uStack_240;
  _Any_data local_238;
  BVHBuildNode **ppBStack_228;
  code *pcStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> local_138 [11];
  
  auVar31._8_4_ = 0xff7fffff;
  auVar31._0_8_ = 0xff7fffffff7fffff;
  auVar31._12_4_ = 0xff7fffff;
  local_2a8 = 0x7f7fffff7f7fffff;
  uStack_2a0 = 0x7f7fffff;
  uStack_29c = 0xff7fffff;
  uVar3 = vmovlps_avx(auVar31);
  uStack_298 = (undefined4)uVar3;
  uStack_294 = (undefined4)((ulong)uVar3 >> 0x20);
  pBVar5 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar6 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar5 != pBVar6) {
    auVar34._8_4_ = 0x7f7fffff;
    auVar34._0_8_ = 0x7f7fffff7f7fffff;
    auVar34._12_4_ = 0x7f7fffff;
    auVar32 = ZEXT464(0xff7fffff);
    auVar33 = ZEXT464(0x7f7fffff);
    pBVar19 = pBVar5;
    do {
      pPVar10 = &pBVar19->centroid;
      uVar2 = (pBVar19->centroid).super_Tuple3<pbrt::Point3,_float>.x;
      uVar4 = (pBVar19->centroid).super_Tuple3<pbrt::Point3,_float>.y;
      auVar36._4_4_ = uVar4;
      auVar36._0_4_ = uVar2;
      auVar36._8_8_ = 0;
      pBVar19 = pBVar19 + 1;
      auVar35 = ZEXT416((uint)(pPVar10->super_Tuple3<pbrt::Point3,_float>).z);
      auVar9 = vminss_avx(auVar35,auVar33._0_16_);
      auVar33 = ZEXT1664(auVar9);
      auVar34 = vminps_avx(auVar36,auVar34);
      auVar31 = vmaxps_avx(auVar36,auVar31);
      auVar35 = vmaxss_avx(auVar35,auVar32._0_16_);
      auVar32 = ZEXT1664(auVar35);
    } while (pBVar19 != pBVar6);
    local_2a8 = vmovlps_avx(auVar34);
    uVar3 = vmovlps_avx(auVar31);
    uStack_29c = (undefined4)uVar3;
    uStack_298 = (undefined4)((ulong)uVar3 >> 0x20);
    uStack_2a0 = auVar9._0_4_;
    uStack_294 = auVar35._0_4_;
  }
  local_2d8.memoryResource = alloc.memoryResource;
  local_2d0 = totalNodes;
  local_280 = orderedPrims;
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            (&local_2f8,((long)pBVar6 - (long)pBVar5 >> 4) * -0x5555555555555555,
             (allocator_type *)local_238._M_pod_data);
  pBVar5 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar6 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_258 = (void *)0x0;
  uStack_250 = 0;
  pcStack_248 = (code *)0x0;
  uStack_240 = (code *)0x0;
  local_258 = operator_new(0x18);
  local_238._M_unused._M_object = &local_258;
  *(vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> **)local_258 = &local_2f8;
  *(vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> **)((long)local_258 + 8) =
       bvhPrimitives;
  *(undefined8 **)((long)local_258 + 0x10) = &local_2a8;
  uStack_240 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:405:42)>
               ::_M_invoke;
  pcStack_248 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:405:42)>
                ::_M_manager;
  local_238._8_8_ = 0;
  pcStack_220 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
                ::_M_invoke;
  ppBStack_228 = (BVHBuildNode **)
                 std::
                 _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
                 ::_M_manager;
  local_288 = bvhPrimitives;
  ParallelFor(0,((long)pBVar6 - (long)pBVar5 >> 4) * -0x5555555555555555,
              (function<void_(long,_long)> *)&local_238);
  if (ppBStack_228 != (BVHBuildNode **)0x0) {
    (*(code *)ppBStack_228)(&local_238,&local_238,3);
  }
  if (pcStack_248 != (code *)0x0) {
    (*pcStack_248)(&local_258,&local_258,3);
  }
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            (&local_2c8,
             (long)local_2f8.
                   super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2f8.
                   super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)local_238._M_pod_data);
  pMVar12 = local_2c8.
            super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pMVar20 = local_2f8.
            super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  pMVar17 = local_2f8.
            super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar15 = 0;
  do {
    local_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    uStack_160 = 0;
    uStack_158 = 0;
    uStack_150 = 0;
    uStack_148 = 0;
    uStack_140 = 0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1a8 = 0;
    uStack_1a0 = 0;
    uStack_198 = 0;
    uStack_190 = 0;
    uStack_188 = 0;
    uStack_180 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    uStack_1e8 = 0;
    uStack_1e0 = 0;
    uStack_1d8 = 0;
    uStack_1d0 = 0;
    uStack_1c8 = 0;
    uStack_1c0 = 0;
    local_238._M_unused._M_object = (void *)0x0;
    local_238._8_8_ = (BVHBuildNode *)0x0;
    ppBStack_228 = (BVHBuildNode **)0x0;
    pcStack_220 = (code *)0x0;
    uStack_218 = 0;
    uStack_210 = 0;
    uStack_208 = 0;
    uStack_200 = 0;
    pvVar27 = &local_2c8;
    pvVar11 = &local_2c8;
    if ((uVar15 & 1) == 0) {
      pvVar27 = &local_2f8;
      pvVar11 = &local_2f8;
    }
    pMVar7 = (pvVar11->
             super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pMVar24 = (pvVar27->
              super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>).
              _M_impl.super__Vector_impl_data._M_start;
    for (pMVar25 = pMVar24; pMVar25 != pMVar7; pMVar25 = pMVar25 + 1) {
      piVar1 = (int *)((long)&local_238 +
                      (ulong)(pMVar25->mortonCode >> (uVar15 * 6 & 0x1f) & 0x3f) * 4);
      *piVar1 = *piVar1 + 1;
    }
    lVar26 = 1;
    iVar28 = 0;
    local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_138[0].
                          super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    do {
      iVar28 = iVar28 + *(int *)((long)&uStack_240 + lVar26 * 4 + 4);
      *(int *)((long)&local_138[0].
                      super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar26 * 4) = iVar28;
      lVar26 = lVar26 + 1;
    } while (lVar26 != 0x40);
    for (; pMVar24 != pMVar7; pMVar24 = pMVar24 + 1) {
      uVar21 = (ulong)(pMVar24->mortonCode >> (uVar15 * 6 & 0x1f) & 0x3f);
      iVar28 = *(int *)((long)&local_138[0].
                               super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar21 * 4);
      *(int *)((long)&local_138[0].
                      super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar21 * 4) = iVar28 + 1;
      pvVar27 = &local_2f8;
      if ((uVar15 & 1) == 0) {
        pvVar27 = &local_2c8;
      }
      (pvVar27->super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>).
      _M_impl.super__Vector_impl_data._M_start[iVar28] = *pMVar24;
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != 5);
  local_2f8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_2c8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_2c8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_start = pMVar17;
  local_2c8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_2f8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_2f8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_finish = pMVar12;
  local_2f8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2c8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2c8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar20;
  if (pMVar17 != (pointer)0x0) {
    operator_delete(pMVar17,(long)pMVar20 - (long)pMVar17);
  }
  local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (LBVHTreelet *)0x0;
  uVar23 = 0;
  uVar21 = (ulong)((long)local_2f8.
                         super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_2f8.
                        super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_start = (LBVHTreelet *)0x0;
  local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_finish = (LBVHTreelet *)0x0;
  if (0 < (int)uVar21) {
    iVar28 = 1;
    pMVar17 = local_2f8.
              super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pMVar20 = local_2f8.
              super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar29 = 1;
    local_290 = this;
    do {
      iVar22 = (int)uVar23;
      if ((uVar29 == (uVar21 & 0xffffffff)) ||
         (((pMVar17[uVar29].mortonCode ^ pMVar17[iVar22].mortonCode) & 0x3ffc0000) != 0)) {
        iVar16 = (*(local_2d8.memoryResource)->_vptr_memory_resource[2])
                           (local_2d8.memoryResource,(long)(iVar28 + iVar22 * -2) * 0x38,8);
        local_238._8_8_ = CONCAT44(extraout_var,iVar16);
        local_238._4_4_ = (int)uVar29 - iVar22;
        local_238._0_4_ = iVar22;
        if (local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::
          _M_realloc_insert<pbrt::LBVHTreelet>
                    (local_138,
                     (iterator)
                     local_138[0].
                     super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(LBVHTreelet *)&local_238);
        }
        else {
          *(void **)local_138[0].
                    super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                    _M_impl.super__Vector_impl_data._M_finish = local_238._M_unused._M_object;
          (local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
           _M_impl.super__Vector_impl_data._M_finish)->buildNodes = (BVHBuildNode *)local_238._8_8_;
          local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_138[0].
               super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar23 = uVar29 & 0xffffffff;
        pMVar17 = local_2f8.
                  super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar20 = local_2f8.
                  super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      iVar28 = iVar28 + 2;
      uVar21 = (ulong)((long)pMVar20 - (long)pMVar17) >> 3;
      bVar8 = (long)uVar29 < (long)(int)uVar21;
      this = local_290;
      uVar29 = uVar29 + 1;
    } while (bVar8);
  }
  pLVar14 = local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pLVar13 = local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_2c8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_2c8.
                        super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_278 = (long *)0x0;
  uStack_270 = 0;
  pcStack_268 = (code *)0x0;
  pcStack_260 = (code *)0x0;
  local_278 = (long *)operator_new(0x38);
  local_238._M_unused._M_object = &local_278;
  *local_278 = (long)local_138;
  local_278[1] = (long)this;
  local_278[2] = (long)local_288;
  local_278[3] = (long)&local_2f8;
  local_278[4] = (long)local_280;
  local_278[5] = (long)&local_2c8;
  local_278[6] = (long)&local_2d0;
  pcStack_260 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:437:44)>
                ::_M_invoke;
  pcStack_268 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:437:44)>
                ::_M_manager;
  local_238._8_8_ = 0;
  pcStack_220 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
                ::_M_invoke;
  ppBStack_228 = (BVHBuildNode **)
                 std::
                 _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
                 ::_M_manager;
  ParallelFor(0,(long)pLVar14 - (long)pLVar13 >> 4,(function<void_(long,_long)> *)&local_238);
  if (ppBStack_228 != (BVHBuildNode **)0x0) {
    (*(code *)ppBStack_228)(&local_238,&local_238,3);
  }
  if (pcStack_268 != (code *)0x0) {
    (*pcStack_268)(&local_278,&local_278,3);
  }
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = (BVHBuildNode **)0x0;
  ppBStack_228 = (BVHBuildNode **)0x0;
  std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::reserve
            ((vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)&local_238,
             (long)local_138[0].
                   super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_138[0].
                   super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4);
  pLVar13 = local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    __args = &(local_138[0].
               super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
               super__Vector_impl_data._M_start)->buildNodes;
    do {
      if ((BVHBuildNode **)local_238._8_8_ == ppBStack_228) {
        std::vector<pbrt::BVHBuildNode*,std::allocator<pbrt::BVHBuildNode*>>::
        _M_realloc_insert<pbrt::BVHBuildNode*const&>
                  ((vector<pbrt::BVHBuildNode*,std::allocator<pbrt::BVHBuildNode*>> *)
                   local_238._M_pod_data,(iterator)local_238._8_8_,__args);
      }
      else {
        *(BVHBuildNode **)local_238._8_8_ = *__args;
        local_238._8_8_ = local_238._8_8_ + 8;
      }
      pLVar30 = (LBVHTreelet *)(__args + 1);
      __args = __args + 2;
    } while (pLVar30 != pLVar13);
  }
  pBVar18 = buildUpperSAH(this,local_2d8,
                          (vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *)
                          &local_238,0,(int)((ulong)(local_238._8_8_ - local_238._0_8_) >> 3),
                          local_2d0);
  if (local_238._M_unused._M_object != (void *)0x0) {
    operator_delete(local_238._M_unused._M_object,(long)ppBStack_228 - local_238._0_8_);
  }
  if (local_138[0].super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
      .super__Vector_impl_data._M_start != (LBVHTreelet *)0x0) {
    operator_delete(local_138[0].
                    super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138[0].
                          super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138[0].
                          super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pBVar18;
}

Assistant:

BVHBuildNode *BVHAggregate::buildHLBVH(Allocator alloc,
                                       const std::vector<BVHPrimitive> &bvhPrimitives,
                                       std::atomic<int> *totalNodes,
                                       std::vector<PrimitiveHandle> &orderedPrims) {
    // Compute bounding box of all primitive centroids
    Bounds3f bounds;
    for (const BVHPrimitive &pi : bvhPrimitives)
        bounds = Union(bounds, pi.centroid);

    // Compute Morton indices of primitives
    std::vector<MortonPrimitive> mortonPrims(bvhPrimitives.size());
    ParallelFor(0, bvhPrimitives.size(), [&](int64_t i) {
        // Initialize _mortonPrims[i]_ for _i_th primitive
        constexpr int mortonBits = 10;
        constexpr int mortonScale = 1 << mortonBits;
        mortonPrims[i].primitiveIndex = bvhPrimitives[i].primitiveIndex;
        Vector3f centroidOffset = bounds.Offset(bvhPrimitives[i].centroid);
        Vector3f offset = centroidOffset * mortonScale;
        mortonPrims[i].mortonCode = EncodeMorton3(offset.x, offset.y, offset.z);
    });

    // Radix sort primitive Morton indices
    RadixSort(&mortonPrims);

    // Create LBVH treelets at bottom of BVH
    // Find intervals of primitives for each treelet
    std::vector<LBVHTreelet> treeletsToBuild;
    for (int start = 0, end = 1; end <= (int)mortonPrims.size(); ++end) {
        uint32_t mask = 0b00111111111111000000000000000000;
        if (end == (int)mortonPrims.size() || ((mortonPrims[start].mortonCode & mask) !=
                                               (mortonPrims[end].mortonCode & mask))) {
            // Add entry to _treeletsToBuild_ for this treelet
            int nPrimitives = end - start;
            int maxBVHNodes = 2 * nPrimitives - 1;
            BVHBuildNode *nodes = alloc.allocate_object<BVHBuildNode>(maxBVHNodes);
            treeletsToBuild.push_back({start, nPrimitives, nodes});

            start = end;
        }
    }

    // Create LBVHs for treelets in parallel
    std::atomic<int> orderedPrimsOffset(0);
    ParallelFor(0, treeletsToBuild.size(), [&](int i) {
        // Generate _i_th LBVH treelet
        int nodesCreated = 0;
        const int firstBitIndex = 29 - 12;
        LBVHTreelet &tr = treeletsToBuild[i];
        tr.buildNodes = emitLBVH(
            tr.buildNodes, bvhPrimitives, &mortonPrims[tr.startIndex], tr.nPrimitives,
            &nodesCreated, orderedPrims, &orderedPrimsOffset, firstBitIndex);
        *totalNodes += nodesCreated;
    });

    // Create and return SAH BVH from LBVH treelets
    std::vector<BVHBuildNode *> finishedTreelets;
    finishedTreelets.reserve(treeletsToBuild.size());
    for (LBVHTreelet &treelet : treeletsToBuild)
        finishedTreelets.push_back(treelet.buildNodes);
    return buildUpperSAH(alloc, finishedTreelets, 0, finishedTreelets.size(), totalNodes);
}